

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O3

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::find
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,uint64_t time_reference,
          CInput *t)

{
  iterator *piVar1;
  iterator iVar2;
  iterator local_28;
  
  this->time_reference = time_reference;
  local_28._cell = (this->super_list<r_exec::CInput>).used_cells_head;
  local_28.buffer = this;
  piVar1 = (iterator *)&time_buffer<r_exec::CInput,r_exec::CInput::IsInvalidated>::end_iterator;
  if (local_28._cell != DAT_001c4a18) {
    do {
      piVar1 = &local_28;
      if (*(_Object **)
           ((long)(((local_28.buffer)->super_list<r_exec::CInput>).cells.
                   super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_28._cell) + 0x20) ==
          (t->input).object) goto LAB_00194cf6;
      iterator::operator++(&local_28);
    } while (local_28._cell != DAT_001c4a18);
    piVar1 = (iterator *)&time_buffer<r_exec::CInput,r_exec::CInput::IsInvalidated>::end_iterator;
  }
LAB_00194cf6:
  iVar2._cell = local_28._cell;
  iVar2.buffer = piVar1->buffer;
  return iVar2;
}

Assistant:

iterator find(uint64_t time_reference, const T &t)
    {
        iterator i;

        for (i = begin(time_reference); i != end(); ++i) {
            if ((*i) == t) {
                return i;
            }
        }

        return end_iterator;
    }